

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iter.c
# Opt level: O3

void * get_column(ecs_iter_t *it,ecs_size_t size,int32_t column,int32_t row)

{
  short sVar1;
  ecs_ref_t *peVar2;
  _Bool _Var3;
  undefined8 in_RAX;
  void *pvVar4;
  ecs_entity_t *peVar5;
  ecs_entity_t entity;
  int *piVar6;
  char *param;
  void *pvVar7;
  int16_t offset;
  int iVar8;
  long lVar9;
  ulong uVar10;
  int32_t table_column;
  uint local_34;
  
  local_34 = (uint)((ulong)in_RAX >> 0x20);
  if (column == 0) {
    peVar5 = it->entities;
  }
  else {
    _Var3 = get_table_column(it,column,(int32_t *)&local_34);
    if (_Var3) {
      if ((long)(int)local_34 < 0) {
        peVar2 = it->table->references;
        _ecs_assert(peVar2 != (ecs_ref_t *)0x0,0xc,(char *)0x0,"refs != NULL",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/duddel[P]flecs-lab/build_O3/flecs-clone-prefix/src/flecs-clone/src/iter.c"
                    ,0x1b);
        if (peVar2 == (ecs_ref_t *)0x0) {
          __assert_fail("refs != ((void*)0)",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/duddel[P]flecs-lab/build_O3/flecs-clone-prefix/src/flecs-clone/src/iter.c"
                        ,0x1b,
                        "const void *get_shared_column(const ecs_iter_t *, ecs_size_t, int32_t)");
        }
        if (size == 0) {
          uVar10 = (ulong)~local_34;
        }
        else {
          uVar10 = (ulong)~local_34;
          entity = ecs_get_typeid(it->world,peVar2[uVar10].component);
          piVar6 = (int *)ecs_get_w_entity(it->world,entity,1);
          _ecs_assert(piVar6 != (int *)0x0,0xc,(char *)0x0,"cdata != NULL",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/duddel[P]flecs-lab/build_O3/flecs-clone-prefix/src/flecs-clone/src/iter.c"
                      ,0x26);
          if (piVar6 == (int *)0x0) {
            __assert_fail("cdata != ((void*)0)",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/duddel[P]flecs-lab/build_O3/flecs-clone-prefix/src/flecs-clone/src/iter.c"
                          ,0x26,
                          "const void *get_shared_column(const ecs_iter_t *, ecs_size_t, int32_t)");
          }
          iVar8 = *piVar6;
          param = ecs_get_name(it->world,it->system);
          _ecs_assert(iVar8 == size,0x17,param,"cdata->size == size",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/duddel[P]flecs-lab/build_O3/flecs-clone-prefix/src/flecs-clone/src/iter.c"
                      ,0x28);
          if (*piVar6 != size) {
            __assert_fail("cdata->size == size",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/duddel[P]flecs-lab/build_O3/flecs-clone-prefix/src/flecs-clone/src/iter.c"
                          ,0x28,
                          "const void *get_shared_column(const ecs_iter_t *, ecs_size_t, int32_t)");
          }
        }
        pvVar7 = ecs_get_ref_w_entity
                           (it->world,peVar2 + uVar10,peVar2[uVar10].entity,peVar2[uVar10].component
                           );
        return pvVar7;
      }
      _ecs_assert(it->table_columns != (void *)0x0,0xc,(char *)0x0,"it->table_columns != NULL",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/duddel[P]flecs-lab/build_O3/flecs-clone-prefix/src/flecs-clone/src/iter.c"
                  ,10);
      pvVar7 = it->table_columns;
      if (pvVar7 == (void *)0x0) {
        __assert_fail("it->table_columns != ((void*)0)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/duddel[P]flecs-lab/build_O3/flecs-clone-prefix/src/flecs-clone/src/iter.c"
                      ,10,
                      "void *get_owned_column_ptr(const ecs_iter_t *, ecs_size_t, int32_t, int32_t)"
                     );
      }
      lVar9 = (long)(int)local_34 * 0x10;
      _ecs_assert(*(short *)((long)pvVar7 + lVar9 + -8) != 0,0x16,(char *)0x0,"column->size != 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/duddel[P]flecs-lab/build_O3/flecs-clone-prefix/src/flecs-clone/src/iter.c"
                  ,0xe);
      sVar1 = *(short *)((long)pvVar7 + lVar9 + -8);
      if (sVar1 == 0) {
        __assert_fail("column->size != 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/duddel[P]flecs-lab/build_O3/flecs-clone-prefix/src/flecs-clone/src/iter.c"
                      ,0xe,
                      "void *get_owned_column_ptr(const ecs_iter_t *, ecs_size_t, int32_t, int32_t)"
                     );
      }
      _ecs_assert(sVar1 == size || size == 0,0x17,(char *)0x0,"!size || column->size == size",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/duddel[P]flecs-lab/build_O3/flecs-clone-prefix/src/flecs-clone/src/iter.c"
                  ,0xf);
      iVar8 = (int)*(short *)((long)pvVar7 + lVar9 + -8);
      if ((size != 0) && (iVar8 != size)) {
        __assert_fail("!size || column->size == size",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/duddel[P]flecs-lab/build_O3/flecs-clone-prefix/src/flecs-clone/src/iter.c"
                      ,0xf,
                      "void *get_owned_column_ptr(const ecs_iter_t *, ecs_size_t, int32_t, int32_t)"
                     );
      }
      sVar1 = *(short *)((long)pvVar7 + lVar9 + -6);
      offset = 0x10;
      if (0x10 < sVar1) {
        offset = sVar1;
      }
      pvVar4 = _ecs_vector_first(*(ecs_vector_t **)((long)pvVar7 + lVar9 + -0x10),iVar8,offset);
      peVar5 = (ecs_entity_t *)
               (((long)row + (long)it->offset) * (long)*(short *)((long)pvVar7 + lVar9 + -8) +
               (long)pvVar4);
    }
    else {
      peVar5 = (ecs_entity_t *)0x0;
    }
  }
  return peVar5;
}

Assistant:

static
void* get_column(
    const ecs_iter_t *it,
    ecs_size_t size,
    int32_t column,
    int32_t row)
{
    int32_t table_column;

    if (!column) {
        return it->entities;
    }

    if (!get_table_column(it, column, &table_column)) {
        return NULL;
    }

    if (table_column < 0) {
        return (void*)get_shared_column(it, size, table_column);
    } else {
        return get_owned_column_ptr(it, size, table_column, row);
    }
}